

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZQuadraticTetra> *this,void **vtt,int64_t id,
          TPZVec<long> *nodeindexes,int matind,TPZGeoMesh *mesh)

{
  long *in_RSI;
  long *in_RDI;
  TPZGeoMesh *in_stack_00000018;
  int in_stack_00000024;
  undefined4 in_stack_00000030;
  TPZAutoPointer<TPZRefPattern> *in_stack_ffffffffffffffc0;
  
  TPZGeoElRefLess<pzgeom::TPZQuadraticTetra>::TPZGeoElRefLess
            ((TPZGeoElRefLess<pzgeom::TPZQuadraticTetra> *)id,&nodeindexes->_vptr_TPZVec,
             CONCAT44(matind,in_stack_00000030),(TPZVec<long> *)mesh,in_stack_00000024,
             in_stack_00000018);
  *in_RDI = *in_RSI;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x60)) = in_RSI[5];
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x40));
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(int64_t id,TPZVec<int64_t> &nodeindexes,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(id,nodeindexes,matind,mesh) {
}